

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol_spbcgs_serial.c
# Opt level: O3

int check_vector(N_Vector X,N_Vector Y,sunrealtype tol)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  
  lVar2 = N_VGetArrayPointer();
  lVar3 = N_VGetArrayPointer(Y);
  if (0 < problem_size) {
    iVar5 = 0;
    lVar4 = 0;
    do {
      iVar1 = SUNRCompareTol(*(undefined8 *)(lVar2 + lVar4 * 8),*(undefined8 *)(lVar3 + lVar4 * 8));
      iVar5 = iVar5 + iVar1;
      lVar4 = lVar4 + 1;
    } while (lVar4 < problem_size);
    if (0 < iVar5) {
      if (problem_size < 1) {
        dVar6 = 0.0;
      }
      else {
        lVar4 = 0;
        dVar7 = 0.0;
        do {
          dVar6 = *(double *)(lVar2 + lVar4 * 8);
          dVar6 = ABS((dVar6 - *(double *)(lVar3 + lVar4 * 8)) / dVar6);
          if (dVar6 <= dVar7) {
            dVar6 = dVar7;
          }
          lVar4 = lVar4 + 1;
          dVar7 = dVar6;
        } while (problem_size != lVar4);
      }
      printf("check err failure: maxerr = %g (tol = %g)\n",dVar6,tol);
      return 1;
    }
  }
  return 0;
}

Assistant:

int check_vector(N_Vector X, N_Vector Y, sunrealtype tol)
{
  int failure = 0;
  sunindextype i;
  sunrealtype *Xdata, *Ydata, maxerr;

  Xdata = N_VGetArrayPointer(X);
  Ydata = N_VGetArrayPointer(Y);

  /* check vector data */
  for (i = 0; i < problem_size; i++)
  {
    failure += SUNRCompareTol(Xdata[i], Ydata[i], tol);
  }

  if (failure > ZERO)
  {
    maxerr = ZERO;
    for (i = 0; i < problem_size; i++)
    {
      maxerr = SUNMAX(SUNRabs(Xdata[i] - Ydata[i]) / SUNRabs(Xdata[i]), maxerr);
    }
    printf("check err failure: maxerr = %" GSYM " (tol = %" GSYM ")\n", maxerr,
           tol);
    return (1);
  }
  else { return (0); }
}